

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDockAreaLayoutInfo * __thiscall QDockWidgetGroupWindow::tabLayoutInfo(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  bool bVar2;
  QLayout *pQVar3;
  QDockAreaLayoutInfo *pQVar4;
  QDockAreaLayoutInfo *pQVar5;
  long lVar6;
  QDockAreaLayoutInfo *unaff_R14;
  QDockAreaLayoutInfo *pQVar7;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *this_00;
  
  pQVar3 = QWidget::layout((QWidget *)this);
  pQVar4 = (QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem;
  do {
    if (pQVar4 == (QDockAreaLayoutInfo *)0x0) {
      return (QDockAreaLayoutInfo *)0x0;
    }
    if (pQVar4->tabbed != false) {
      return pQVar4;
    }
    this_00 = (pQVar4->item_list).d.ptr;
    pQVar5 = (QDockAreaLayoutInfo *)0x0;
    bVar1 = false;
    for (lVar6 = (pQVar4->item_list).d.size * 0x28; pQVar7 = unaff_R14, lVar6 != 0;
        lVar6 = lVar6 + -0x28) {
      bVar2 = QDockAreaLayoutItem::skip(this_00);
      if ((!bVar2) && ((this_00->flags & 1) == 0)) {
        if (pQVar5 == (QDockAreaLayoutInfo *)0x0) {
          if (!bVar1) {
            pQVar5 = this_00->subinfo;
            if (pQVar5 == (QDockAreaLayoutInfo *)0x0) {
              if (this_00->widgetItem != (QLayoutItem *)0x0) {
                bVar1 = true;
              }
              pQVar5 = (QDockAreaLayoutInfo *)0x0;
            }
            goto LAB_003feec8;
          }
          pQVar5 = (QDockAreaLayoutInfo *)0x0;
        }
        pQVar7 = (QDockAreaLayoutInfo *)0x0;
        break;
      }
LAB_003feec8:
      this_00 = this_00 + 1;
    }
    unaff_R14 = pQVar7;
    if (bVar1) {
      unaff_R14 = pQVar4;
      pQVar5 = pQVar4;
    }
    pQVar4 = pQVar5;
    if (lVar6 != 0) {
      return pQVar7;
    }
    if (bVar1) {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

QDockAreaLayoutInfo *QDockWidgetGroupWindow::layoutInfo() const
{
    return static_cast<QDockWidgetGroupLayout *>(layout())->dockAreaLayoutInfo();
}